

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.cpp
# Opt level: O2

void de::anon_unknown_1::runAppendListTest
               (deUint32 numThreads,deUint32 numElements,deUint32 numElementsHint)

{
  deInt32 *pdVar1;
  TestElem *pTVar2;
  deUint32 dVar3;
  size_t sVar4;
  uint uVar5;
  Block *pBVar6;
  pointer pSVar7;
  ulong uVar8;
  TestThread *this;
  SharedPtrStateBase *pSVar9;
  pointer puVar10;
  long lVar11;
  SharedPtr<de::(anonymous_namespace)::TestThread> *this_00;
  deUint32 threadNdx;
  size_type sVar12;
  ulong uVar13;
  allocator_type local_a9;
  ulong local_a8;
  deUint32 local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> countByThread;
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  local_80;
  SharedState sharedState;
  
  uVar8 = (ulong)numThreads;
  local_9c = numElements;
  sharedState.numElements = numElements;
  SpinBarrier::SpinBarrier(&sharedState.barrier,numThreads);
  sharedState.testList.m_numElements = 0;
  sharedState.testList.m_blockSize = (ulong)numElementsHint;
  pBVar6 = (Block *)operator_new(0x18);
  AppendList<de::(anonymous_namespace)::TestElem>::Block::Block(pBVar6,0,(ulong)numElementsHint);
  uVar13 = uVar8 * 0x10;
  local_a8 = uVar8;
  sharedState.testList.m_first = pBVar6;
  sharedState.testList.m_last = pBVar6;
  pSVar7 = (pointer)operator_new(uVar13);
  local_80.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar7 + uVar8;
  for (uVar8 = 0;
      local_80.
      super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)&pSVar7->m_ptr + uVar8),
      uVar13 != uVar8; uVar8 = uVar8 + 0x10) {
    (local_80.
     super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->m_ptr = (TestThread *)0x0;
    (local_80.
     super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->m_state = (SharedPtrStateBase *)0x0;
  }
  lVar11 = 0;
  local_80.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pSVar7;
  for (uVar8 = 0; local_a8 != uVar8; uVar8 = uVar8 + 1) {
    this = (TestThread *)operator_new(0x28);
    Thread::Thread((Thread *)this);
    (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_00282aa0;
    this->m_shared = &sharedState;
    this->m_threadNdx = (deUint32)uVar8;
    countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    pSVar9 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar9->strongRefCount = 0;
    pSVar9->weakRefCount = 0;
    pSVar9->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00282ae0;
    pSVar9[1]._vptr_SharedPtrStateBase = (_func_int **)this;
    pSVar9->strongRefCount = 1;
    pSVar9->weakRefCount = 1;
    countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pSVar9;
    if (*(SharedPtrStateBase **)((long)&pSVar7->m_state + lVar11) != pSVar9) {
      this_00 = (SharedPtr<de::(anonymous_namespace)::TestThread> *)((long)&pSVar7->m_ptr + lVar11);
      SharedPtr<de::(anonymous_namespace)::TestThread>::release(this_00);
      this_00->m_ptr = this;
      this_00->m_state = pSVar9;
      LOCK();
      pSVar9->strongRefCount = pSVar9->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &this_00->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pSVar7 = local_80.
               super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    SharedPtr<de::(anonymous_namespace)::TestThread>::~SharedPtr
              ((SharedPtr<de::(anonymous_namespace)::TestThread> *)&countByThread);
    Thread::start(*(Thread **)((long)&pSVar7->m_ptr + lVar11));
    lVar11 = lVar11 + 0x10;
  }
  for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 0x10) {
    Thread::join(*(Thread **)((long)&pSVar7->m_ptr + uVar8));
  }
  if (sharedState.testList.m_numElements != local_9c * local_a8) {
    deAssertFail("sharedState.testList.size() == (size_t)numElements*(size_t)numThreads",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                 ,0x6f);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&countByThread,local_a8,&local_a9);
  sVar4 = sharedState.testList.m_blockSize;
  for (puVar10 = countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      puVar10 !=
      countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
    *puVar10 = 0;
  }
  uVar8 = 0;
  pBVar6 = sharedState.testList.m_first;
  while ((dVar3 = local_9c, pBVar6 != sharedState.testList.m_last ||
         (uVar8 != sharedState.testList.m_numElements % sharedState.testList.m_blockSize))) {
    pTVar2 = pBVar6->elements;
    uVar5 = pTVar2[uVar8].threadNdx;
    if ((uint)local_a8 <= uVar5) {
      deAssertFail("de::inBounds(elem.threadNdx, 0u, numThreads)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                   ,0x7c);
      uVar5 = pTVar2[uVar8].threadNdx;
    }
    uVar13 = (ulong)uVar5;
    uVar5 = countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13];
    if (uVar5 != pTVar2[uVar8].elemNdx) {
      deAssertFail("countByThread[elem.threadNdx] == elem.elemNdx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                   ,0x7d);
      uVar13 = (ulong)pTVar2[uVar8].threadNdx;
      uVar5 = countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13];
    }
    countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar13] = uVar5 + 1;
    uVar8 = uVar8 + 1;
    if (uVar8 == sVar4) {
      pBVar6 = pBVar6->next;
      uVar8 = 0;
    }
  }
  for (sVar12 = 0; local_a8 != sVar12; sVar12 = sVar12 + 1) {
    if (countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar12] != dVar3) {
      deAssertFail("countByThread[threadNdx] == numElements",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                   ,0x83);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&countByThread.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ::~vector(&local_80);
  SharedState::~SharedState(&sharedState);
  return;
}

Assistant:

void runAppendListTest (deUint32 numThreads, deUint32 numElements, deUint32 numElementsHint)
{
	SharedState				sharedState		(numThreads, numElements, numElementsHint);
	vector<TestThreadSp>	threads			(numThreads);

	for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
	{
		threads[threadNdx] = TestThreadSp(new TestThread(&sharedState, threadNdx));
		threads[threadNdx]->start();
	}

	for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
		threads[threadNdx]->join();

	DE_TEST_ASSERT(sharedState.testList.size() == (size_t)numElements*(size_t)numThreads);

	{
		vector<deUint32>	countByThread	(numThreads);

		std::fill(countByThread.begin(), countByThread.end(), 0);

		for (AppendList<TestElem>::const_iterator elemIter = sharedState.testList.begin();
			 elemIter != sharedState.testList.end();
			 ++elemIter)
		{
			const TestElem&	elem	= *elemIter;

			DE_TEST_ASSERT(de::inBounds(elem.threadNdx, 0u, numThreads));
			DE_TEST_ASSERT(countByThread[elem.threadNdx] == elem.elemNdx);

			countByThread[elem.threadNdx] += 1;
		}

		for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
			DE_TEST_ASSERT(countByThread[threadNdx] == numElements);
	}
}